

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodebuild_extract.cpp
# Opt level: O1

void __thiscall
FNodeBuilder::Extract
          (FNodeBuilder *this,node_t **outNodes,int *nodeCount,seg_t **outSegs,
          glsegextra_t **outSegExtras,int *segCount,subsector_t **outSubs,int *subCount,
          vertex_t **outVerts,int *vertCount)

{
  uint uVar1;
  FPrivVert *pFVar2;
  FPrivSeg *pFVar3;
  side_t *psVar4;
  line_t *plVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  uint *puVar11;
  int iVar12;
  vertex_t *pvVar13;
  double *pdVar14;
  ulong uVar15;
  subsector_t *psVar16;
  node_t *pnVar17;
  seg_t *psVar18;
  glsegextra_t *pgVar19;
  glseg_t *pgVar20;
  DWORD DVar21;
  long lVar22;
  USegPtr *pUVar23;
  long lVar24;
  long lVar25;
  vertex_t *pvVar26;
  long lVar27;
  glseg_t *pgVar28;
  node_t *pnVar29;
  long lVar30;
  undefined8 *puVar31;
  long lVar32;
  ulong uVar33;
  bool bVar34;
  byte bVar35;
  TArray<FNodeBuilder::glseg_t,_FNodeBuilder::glseg_t> local_50;
  glsegextra_t **local_40;
  uint *local_38;
  
  bVar35 = 0;
  uVar1 = (this->Vertices).Count;
  uVar33 = (ulong)(int)uVar1;
  *vertCount = uVar1;
  auVar6._8_8_ = 0;
  auVar6._0_8_ = uVar33;
  uVar15 = 0xffffffffffffffff;
  if (SUB168(auVar6 * ZEXT816(0x38),8) == 0) {
    uVar15 = SUB168(auVar6 * ZEXT816(0x38),0);
  }
  local_40 = outSegExtras;
  local_38 = (uint *)segCount;
  pvVar13 = (vertex_t *)operator_new__(uVar15);
  if (uVar33 != 0) {
    pvVar26 = pvVar13;
    do {
      (pvVar26->p).X = 0.0;
      (pvVar26->p).Y = 0.0;
      pvVar26->viewangle = 0;
      pvVar26->angletime = 0;
      pvVar26->dirty = true;
      pvVar26->numheights = 0;
      pvVar26->numsectors = 0;
      pvVar26->sectors = (sector_t **)0x0;
      pvVar26->heightlist = (float *)0x0;
      pvVar26 = pvVar26 + 1;
    } while (pvVar26 != pvVar13 + uVar33);
  }
  *outVerts = pvVar13;
  if (0 < (int)uVar1) {
    pFVar2 = (this->Vertices).Array;
    pdVar14 = &(pvVar13->p).Y;
    lVar24 = 0;
    do {
      iVar12 = *(int *)((long)&(pFVar2->super_FSimpleVert).y + lVar24);
      ((DVector2 *)(pdVar14 + -1))->X =
           (double)*(int *)((long)&(pFVar2->super_FSimpleVert).x + lVar24) * 1.52587890625e-05;
      *pdVar14 = (double)iVar12 * 1.52587890625e-05;
      pdVar14 = pdVar14 + 7;
      lVar24 = lVar24 + 0x10;
    } while (uVar33 * 0x10 != lVar24);
  }
  uVar1 = (this->Subsectors).Count;
  *subCount = uVar1;
  auVar7._8_8_ = 0;
  auVar7._0_8_ = (long)(int)uVar1;
  uVar15 = SUB168(auVar7 * ZEXT816(0x60),0);
  if (SUB168(auVar7 * ZEXT816(0x60),8) != 0) {
    uVar15 = 0xffffffffffffffff;
  }
  psVar16 = (subsector_t *)operator_new__(uVar15);
  *outSubs = psVar16;
  memset(psVar16,0,(long)(int)uVar1 * 0x60);
  uVar1 = (this->Nodes).Count;
  auVar8._8_8_ = 0;
  auVar8._0_8_ = (long)(int)uVar1;
  *nodeCount = uVar1;
  uVar15 = 0xffffffffffffffff;
  if (SUB168(auVar8 * ZEXT816(0x48),8) == 0) {
    uVar15 = SUB168(auVar8 * ZEXT816(0x48),0);
  }
  pnVar17 = (node_t *)operator_new__(uVar15);
  *outNodes = pnVar17;
  memcpy(pnVar17,(this->Nodes).Array,(long)(int)uVar1 * 0x48);
  if (0 < *nodeCount) {
    lVar24 = 0x10;
    lVar22 = 0;
    lVar25 = 0;
    do {
      lVar27 = 0;
      do {
        pnVar17 = *outNodes;
        uVar1 = *(uint *)((long)&pnVar17->field_6 + lVar27 * 4 + lVar22 + 4);
        pnVar29 = pnVar17 + uVar1;
        if ((int)uVar1 < 0) {
          pnVar29 = (node_t *)((long)&(*outSubs)[uVar1 & 0x7fffffff].sector + 1);
        }
        *(node_t **)((long)&pnVar17->field_6 + lVar27 * 8 + lVar22 + 8) = pnVar29;
        lVar27 = lVar27 + -1;
      } while (lVar27 != -2);
      lVar27 = lVar24;
      lVar30 = 0;
      do {
        lVar32 = 0;
        do {
          *(float *)((long)&(*outNodes)->x + lVar32 * 4 + lVar27) =
               (float)*(int *)((long)&(*outNodes)->x + lVar32 * 4 + lVar27) * 1.5258789e-05;
          lVar32 = lVar32 + 1;
        } while (lVar32 != 4);
        lVar27 = lVar27 + 0x10;
        bVar34 = lVar30 == 0;
        lVar30 = lVar30 + 1;
      } while (bVar34);
      lVar25 = lVar25 + 1;
      lVar22 = lVar22 + 0x48;
      lVar24 = lVar24 + 0x48;
    } while (lVar25 < *nodeCount);
  }
  if (this->GLNodes == true) {
    local_50.Most = (this->Segs).Count * 5 >> 2;
    local_50.Count = 0;
    local_50.Array =
         (glseg_t *)
         M_Malloc_Dbg((ulong)local_50.Most * 0x50,
                      "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/tarray.h"
                      ,0x91);
    if (0 < *subCount) {
      lVar24 = 0x28;
      lVar22 = 0;
      do {
        iVar12 = CloseSubsector(this,&local_50,(int)lVar22,*outVerts);
        psVar16 = *outSubs;
        *(int *)((long)&((subsector_t *)(psVar16->portalcoverage + -4))->sector + lVar24) = iVar12;
        *(ulong *)((long)(psVar16->portalcoverage + -5) + lVar24) = (ulong)(local_50.Count - iVar12)
        ;
        lVar22 = lVar22 + 1;
        lVar24 = lVar24 + 0x60;
      } while (lVar22 < *subCount);
    }
    puVar11 = local_38;
    uVar1 = local_50.Count;
    uVar33 = (ulong)(int)local_50.Count;
    *local_38 = local_50.Count;
    auVar9._8_8_ = 0;
    auVar9._0_8_ = uVar33;
    uVar15 = SUB168(auVar9 * ZEXT816(0x48),0);
    if (SUB168(auVar9 * ZEXT816(0x48),8) != 0) {
      uVar15 = 0xffffffffffffffff;
    }
    psVar18 = (seg_t *)operator_new__(uVar15);
    *outSegs = psVar18;
    uVar33 = uVar33 << 4;
    if ((int)uVar1 < 0) {
      uVar33 = 0xffffffffffffffff;
    }
    pgVar19 = (glsegextra_t *)operator_new__(uVar33);
    *local_40 = pgVar19;
    if (0 < (int)*puVar11) {
      lVar24 = 0;
      lVar22 = 0;
      lVar25 = 0;
      pgVar20 = local_50.Array;
      do {
        pgVar28 = pgVar20;
        puVar31 = (undefined8 *)((long)&(*outSegs)->v1 + lVar24);
        for (lVar27 = 9; lVar27 != 0; lVar27 = lVar27 + -1) {
          *puVar31 = (pgVar28->super_seg_t).v1;
          pgVar28 = (glseg_t *)((long)pgVar28 + (ulong)bVar35 * -0x10 + 8);
          puVar31 = puVar31 + (ulong)bVar35 * -2 + 1;
        }
        if ((ulong)pgVar20->Partner == 0xffffffff) {
          DVar21 = 0xffffffff;
        }
        else {
          DVar21 = (this->Segs).Array[pgVar20->Partner].storedseg;
        }
        *(DWORD *)((long)&(*local_40)->PartnerSeg + lVar22) = DVar21;
        lVar25 = lVar25 + 1;
        lVar22 = lVar22 + 0x10;
        lVar24 = lVar24 + 0x48;
        pgVar20 = pgVar20 + 1;
      } while (lVar25 < (int)*puVar11);
    }
    TArray<FNodeBuilder::glseg_t,_FNodeBuilder::glseg_t>::~TArray(&local_50);
  }
  else {
    memcpy(*outSubs,(this->Subsectors).Array,(long)*subCount * 0x60);
    uVar1 = (this->Segs).Count;
    uVar33 = (ulong)(int)uVar1;
    *local_38 = uVar1;
    auVar10._8_8_ = 0;
    auVar10._0_8_ = uVar33;
    uVar15 = 0xffffffffffffffff;
    if (SUB168(auVar10 * ZEXT816(0x48),8) == 0) {
      uVar15 = SUB168(auVar10 * ZEXT816(0x48),0);
    }
    psVar18 = (seg_t *)operator_new__(uVar15);
    *outSegs = psVar18;
    *local_40 = (glsegextra_t *)0x0;
    if (0 < (long)uVar33) {
      pFVar3 = (this->Segs).Array;
      pUVar23 = (this->SegList).Array;
      psVar4 = this->Level->Sides;
      plVar5 = this->Level->Lines;
      lVar24 = 0;
      do {
        uVar1 = pUVar23->SegNum;
        psVar18 = *outSegs;
        *(vertex_t **)((long)&psVar18->v1 + lVar24) = *outVerts + pFVar3[uVar1].v1;
        *(vertex_t **)((long)&psVar18->v2 + lVar24) = *outVerts + pFVar3[uVar1].v2;
        *(sector_t **)((long)&psVar18->backsector + lVar24) = pFVar3[uVar1].backsector;
        *(sector_t **)((long)&psVar18->frontsector + lVar24) = pFVar3[uVar1].frontsector;
        *(line_t **)((long)&psVar18->linedef + lVar24) = plVar5 + pFVar3[uVar1].linedef;
        *(side_t **)((long)&psVar18->sidedef + lVar24) = psVar4 + pFVar3[uVar1].sidedef;
        lVar24 = lVar24 + 0x48;
        pUVar23 = (USegPtr *)(&pUVar23->SegNum + 2);
      } while (uVar33 * 0x48 != lVar24);
    }
  }
  iVar12 = *subCount;
  if (0 < (long)iVar12) {
    lVar24 = 0;
    do {
      *(seg_t **)((long)(*outSubs)->portalcoverage + lVar24 + -0x28) =
           *outSegs + *(long *)((long)(*outSubs)->portalcoverage + lVar24 + -0x28);
      lVar24 = lVar24 + 0x60;
    } while ((long)iVar12 * 0x60 != lVar24);
  }
  lVar24 = (long)this->Level->NumLines;
  if (0 < lVar24) {
    plVar5 = this->Level->Lines;
    lVar22 = 0;
    do {
      *(vertex_t **)((long)plVar5->args + lVar22 + -0x2c) =
           *outVerts + *(long *)((long)plVar5->args + lVar22 + -0x2c);
      *(vertex_t **)((long)plVar5->args + lVar22 + -0x24) =
           *outVerts + *(long *)((long)plVar5->args + lVar22 + -0x24);
      lVar22 = lVar22 + 0x98;
    } while (lVar24 * 0x98 - lVar22 != 0);
  }
  return;
}

Assistant:

void FNodeBuilder::Extract (node_t *&outNodes, int &nodeCount,
	seg_t *&outSegs, glsegextra_t *&outSegExtras, int &segCount,
	subsector_t *&outSubs, int &subCount,
	vertex_t *&outVerts, int &vertCount)
{
	int i;

	vertCount = Vertices.Size ();
	outVerts = new vertex_t[vertCount];

	for (i = 0; i < vertCount; ++i)
	{
		outVerts[i].set(Vertices[i].x, Vertices[i].y);
	}

	subCount = Subsectors.Size();
	outSubs = new subsector_t[subCount];
	memset(outSubs, 0, subCount * sizeof(subsector_t));

	nodeCount = Nodes.Size ();
	outNodes = new node_t[nodeCount];

	memcpy (outNodes, &Nodes[0], nodeCount*sizeof(node_t));
	for (i = 0; i < nodeCount; ++i)
	{
		D(Printf(PRINT_LOG, "Node %d:  Splitter[%08x,%08x] [%08x,%08x]\n", i,
			outNodes[i].x, outNodes[i].y, outNodes[i].dx, outNodes[i].dy));
		// Go backwards because on 64-bit systems, both of the intchildren are
		// inside the first in-game child.
		for (int j = 1; j >= 0; --j)
		{
			if (outNodes[i].intchildren[j] & 0x80000000)
			{
				D(Printf(PRINT_LOG, "  subsector %d\n", outNodes[i].intchildren[j] & 0x7FFFFFFF));
				outNodes[i].children[j] = (BYTE *)(outSubs + (outNodes[i].intchildren[j] & 0x7fffffff)) + 1;
			}
			else
			{
				D(Printf(PRINT_LOG, "  node %d\n", outNodes[i].intchildren[j]));
				outNodes[i].children[j] = outNodes + outNodes[i].intchildren[j];
			}
		}
		for (int j = 0; j < 2; ++j)
		{
			for (int k = 0; k < 4; ++k)
			{
				outNodes[i].bbox[j][k] = FIXED2FLOAT(outNodes[i].nb_bbox[j][k]);
			}
		}
	}

	if (GLNodes)
	{
		TArray<glseg_t> segs (Segs.Size()*5/4);

		for (i = 0; i < subCount; ++i)
		{
			DWORD numsegs = CloseSubsector (segs, i, outVerts);
			outSubs[i].numlines = numsegs;
			outSubs[i].firstline = (seg_t *)(size_t)(segs.Size() - numsegs);
		}

		segCount = segs.Size ();
		outSegs = new seg_t[segCount];
		outSegExtras = new glsegextra_t[segCount];

		for (i = 0; i < segCount; ++i)
		{
			outSegs[i] = *(seg_t *)&segs[i];

			if (segs[i].Partner != DWORD_MAX)
			{
				outSegExtras[i].PartnerSeg = Segs[segs[i].Partner].storedseg;
			}
			else
			{
				outSegExtras[i].PartnerSeg = DWORD_MAX;
			}
		}
	}
	else
	{
		memcpy (outSubs, &Subsectors[0], subCount*sizeof(subsector_t));
		segCount = Segs.Size ();
		outSegs = new seg_t[segCount];
		outSegExtras = NULL;
		for (i = 0; i < segCount; ++i)
		{
			const FPrivSeg *org = &Segs[SegList[i].SegNum];
			seg_t *out = &outSegs[i];

			D(Printf(PRINT_LOG, "Seg %d: v1(%d) -> v2(%d)\n", i, org->v1, org->v2));

			out->v1 = outVerts + org->v1;
			out->v2 = outVerts + org->v2;
			out->backsector = org->backsector;
			out->frontsector = org->frontsector;
			out->linedef = Level.Lines + org->linedef;
			out->sidedef = Level.Sides + org->sidedef;
		}
	}
	for (i = 0; i < subCount; ++i)
	{
		outSubs[i].firstline = &outSegs[(size_t)outSubs[i].firstline];
	}

	D(Printf("%i segs, %i nodes, %i subsectors\n", segCount, nodeCount, subCount));

	for (i = 0; i < Level.NumLines; ++i)
	{
		Level.Lines[i].v1 = outVerts + (size_t)Level.Lines[i].v1;
		Level.Lines[i].v2 = outVerts + (size_t)Level.Lines[i].v2;
	}
}